

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

void Imf_3_4::skipChannel(char **readPtr,PixelType typeInFile,size_t xSize)

{
  ArgExc *this;
  
  if (typeInFile < NUM_PIXELTYPES) {
    Xdr::skip<Imf_3_4::CharPtrIO,char_const*>
              (readPtr,(int)xSize << ((&DAT_001b6ed8)[(ulong)typeInFile * 4] & 0x1f));
    return;
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
  __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
skipChannel (const char*& readPtr, PixelType typeInFile, size_t xSize)
{
    switch (typeInFile)
    {
        case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            Xdr::skip<CharPtrIO> (readPtr, Xdr::size<unsigned int> () * xSize);
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            Xdr::skip<CharPtrIO> (readPtr, Xdr::size<half> () * xSize);
            break;

        case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            Xdr::skip<CharPtrIO> (readPtr, Xdr::size<float> () * xSize);
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
    }
}